

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_xor_many(size_t number,roaring_bitmap_t **x)

{
  roaring_bitmap_t *prVar1;
  ulong in_RDI;
  size_t i;
  roaring_bitmap_t *answer;
  roaring_bitmap_t *in_stack_00000038;
  roaring_bitmap_t *in_stack_00000040;
  roaring_bitmap_t *in_stack_00000070;
  roaring_bitmap_t *in_stack_00000078;
  undefined8 local_28;
  roaring_bitmap_t *in_stack_fffffffffffffff8;
  
  if (in_RDI == 0) {
    prVar1 = roaring_bitmap_create();
  }
  else if (in_RDI == 1) {
    prVar1 = roaring_bitmap_copy(in_stack_fffffffffffffff8);
  }
  else {
    prVar1 = roaring_bitmap_lazy_xor(in_stack_00000078,in_stack_00000070);
    for (local_28 = 2; local_28 < in_RDI; local_28 = local_28 + 1) {
      roaring_bitmap_lazy_xor_inplace(in_stack_00000040,in_stack_00000038);
    }
    roaring_bitmap_repair_after_lazy((roaring_bitmap_t *)i);
  }
  return prVar1;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_xor_many(size_t number,
                                          const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_bitmap_t *answer = roaring_bitmap_lazy_xor(x[0], x[1]);
    for (size_t i = 2; i < number; i++) {
        roaring_bitmap_lazy_xor_inplace(answer, x[i]);
    }
    roaring_bitmap_repair_after_lazy(answer);
    return answer;
}